

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

int __thiscall front::symbol::ArraySymbol::getSize(ArraySymbol *this)

{
  NodeType NVar1;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  SharedExNdPtr i;
  
  if (-1 < this->_size) {
    return this->_size;
  }
  p_Var4 = &((this->_dimensions).
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((this->_dimensions).
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
  iVar3 = 1;
  do {
    if (p_Var4 == p_Var2) {
      std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)&i);
      this->_size = iVar3 * *(int *)&((i.
                                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_children).
                                     super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return this->_size;
    }
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,p_Var4
              );
    NVar1 = (i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _type;
    if (NVar1 == CNS) {
      iVar3 = iVar3 * (i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->_value;
    }
    else {
      this->_size = 0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var4 = p_Var4 + 1;
  } while (NVar1 == CNS);
  return 0;
}

Assistant:

int getSize() {
    if (_size >= 0) {
      return _size;
    } else {
      int size = 1;
      for (SharedExNdPtr i : _dimensions) {
        if (i->_type == front::express::NodeType::CNS) {
          size *= i->_value;
        } else {
          _size = 0;
          return _size;
        }
      }
      _size = size * static_pointer_cast<IntSymbol>(_item)->getSize();
      return _size;
    }
  }